

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

TargetOrString * __thiscall
cmGeneratorTarget::ResolveTargetReference
          (TargetOrString *__return_storage_ptr__,cmGeneratorTarget *this,string *name,
          cmLocalGenerator *lg)

{
  cmGeneratorTarget *pcVar1;
  cmGeneratorTarget *tgt;
  cmLocalGenerator *lg_local;
  string *name_local;
  cmGeneratorTarget *this_local;
  TargetOrString *resolved;
  
  TargetOrString::TargetOrString(__return_storage_ptr__);
  pcVar1 = cmLocalGenerator::FindGeneratorTargetToUse(lg,name);
  if (pcVar1 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    __return_storage_ptr__->Target = pcVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::TargetOrString cmGeneratorTarget::ResolveTargetReference(
  std::string const& name, cmLocalGenerator const* lg) const
{
  TargetOrString resolved;

  if (cmGeneratorTarget* tgt = lg->FindGeneratorTargetToUse(name)) {
    resolved.Target = tgt;
  } else {
    resolved.String = name;
  }

  return resolved;
}